

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O2

int __thiscall sptk::reaper::FFT::makefttable(FFT *this,int pow2)

{
  byte bVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  bVar1 = (byte)pow2 & 0x1f;
  iVar5 = 1 << bVar1;
  this->fftSize = iVar5;
  uVar2 = iVar5 / 2;
  this->fft_ftablesize = uVar2;
  uVar7 = 0xffffffffffffffff;
  if (pow2 != 0x1f) {
    uVar7 = (long)(int)uVar2 * 4;
  }
  pfVar3 = (float *)operator_new__(uVar7);
  this->fsine = pfVar3;
  pfVar4 = (float *)operator_new__(uVar7);
  this->fcosine = pfVar4;
  uVar6 = 0 << bVar1;
  uVar7 = (ulong)uVar6;
  if ((int)uVar2 < 1) {
    uVar2 = uVar6;
  }
  dVar10 = 0.0;
  for (; uVar2 != (uint)uVar7; uVar7 = uVar7 + 1) {
    dVar8 = (6.283185307179586 / (double)iVar5) * dVar10;
    dVar9 = sin(dVar8);
    pfVar3[uVar7] = (float)dVar9;
    dVar8 = cos(dVar8);
    pfVar4[uVar7] = (float)dVar8;
    dVar10 = dVar10 + 1.0;
  }
  this->kbase = (this->fft_ftablesize * 2) / this->fftSize;
  this->power2 = pow2;
  return this->fft_ftablesize;
}

Assistant:

int FFT::makefttable(int pow2) {
  int lmx, lm;
  float *c, *s;
  double scl, arg;

  fftSize = 1 << pow2;
  fft_ftablesize = lmx = fftSize/2;
  fsine = new float[lmx];
  fcosine = new float[lmx];
  scl = (M_PI * 2.0) / fftSize;
  for (s = fsine, c = fcosine, lm = 0; lm < lmx; ++lm) {
    arg = scl * lm;
    *s++ = sin(arg);
    *c++ = cos(arg);
  }
  kbase = (fft_ftablesize * 2) / fftSize;
  power2 = pow2;
  return(fft_ftablesize);
}